

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O1

void spliceEdges(DelaunayTriangulation *delTri,Edge *a,Edge *b)

{
  Edge *pEVar1;
  Edge *pEVar2;
  
  if (a->idx != b->idx) {
    pEVar1 = a->onext;
    pEVar1->oprev = b;
    pEVar2 = b->onext;
    pEVar2->oprev = a;
    a->onext = pEVar2;
    b->onext = pEVar1;
  }
  return;
}

Assistant:

void spliceEdges(DelaunayTriangulation *delTri, Edge *a, Edge *b) {
	if (a->idx == b->idx) {
		return;
	}

	Edge *tmp;
	a->onext->oprev = b;
	b->onext->oprev = a;

	tmp = a->onext;
	a->onext = b->onext;
	b->onext = tmp;
}